

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrfac_.c
# Opt level: O0

void qrfac_(int *m,int *n,double *a,int *lda,int *pivot,int *ipvt,int *lipvt,double *rdiag,
           double *acnorm,double *wa)

{
  double *pdVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int *in_RCX;
  long lVar8;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R8;
  long in_R9;
  double dVar9;
  double dVar10;
  long in_stack_00000010;
  double ajnorm;
  double epsmch;
  int minmn;
  double temp;
  int kmax;
  double sum;
  int jp1;
  int k;
  int j;
  int i__;
  double d__3;
  double d__2;
  double d__1;
  int i__3;
  int i__2;
  int i__1;
  int a_offset;
  int a_dim1;
  int c__1;
  double local_b0;
  int local_a4;
  double local_a0;
  int local_7c;
  double local_78;
  int local_6c;
  int local_68;
  int local_64;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar11;
  int local_34;
  long local_30;
  int *local_28;
  long local_18;
  int *local_10;
  int *local_8;
  
  local_34 = 1;
  lVar6 = (long)epsmch + -8;
  lVar7 = in_stack_00000010 + -8;
  iVar3 = *in_RCX;
  iVar5 = iVar3 + 1;
  local_18 = in_RDX + (long)iVar5 * -8;
  local_30 = in_R9 + -4;
  local_28 = in_R8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  dVar9 = dpmpar_(&local_34);
  iVar11 = *local_10;
  for (local_68 = 1; local_68 <= iVar11; local_68 = local_68 + 1) {
    dVar10 = enorm_((int *)CONCAT44(iVar5,iVar11),
                    (double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    *(double *)((long)ajnorm + -8 + (long)local_68 * 8) = dVar10;
    *(undefined8 *)(lVar7 + (long)local_68 * 8) =
         *(undefined8 *)((long)ajnorm + -8 + (long)local_68 * 8);
    *(undefined8 *)(lVar6 + (long)local_68 * 8) = *(undefined8 *)(lVar7 + (long)local_68 * 8);
    if (*local_28 != 0) {
      *(int *)(local_30 + (long)local_68 * 4) = local_68;
    }
  }
  if (*local_10 < *local_8) {
    local_a4 = *local_10;
  }
  else {
    local_a4 = *local_8;
  }
  for (local_68 = 1; local_68 <= local_a4; local_68 = local_68 + 1) {
    if (*local_28 != 0) {
      local_7c = local_68;
      for (local_6c = local_68; local_6c <= *local_10; local_6c = local_6c + 1) {
        dVar10 = *(double *)(lVar7 + (long)local_6c * 8);
        pdVar1 = (double *)(lVar7 + (long)local_7c * 8);
        if (*pdVar1 <= dVar10 && dVar10 != *pdVar1) {
          local_7c = local_6c;
        }
      }
      if (local_7c != local_68) {
        iVar11 = *local_8;
        for (local_64 = 1; local_64 <= iVar11; local_64 = local_64 + 1) {
          uVar2 = *(undefined8 *)(local_18 + (long)(local_64 + local_68 * iVar3) * 8);
          *(undefined8 *)(local_18 + (long)(local_64 + local_68 * iVar3) * 8) =
               *(undefined8 *)(local_18 + (long)(local_64 + local_7c * iVar3) * 8);
          *(undefined8 *)(local_18 + (long)(local_64 + local_7c * iVar3) * 8) = uVar2;
        }
        *(undefined8 *)(lVar7 + (long)local_7c * 8) = *(undefined8 *)(lVar7 + (long)local_68 * 8);
        *(undefined8 *)(lVar6 + (long)local_7c * 8) = *(undefined8 *)(lVar6 + (long)local_68 * 8);
        uVar4 = *(undefined4 *)(local_30 + (long)local_68 * 4);
        *(undefined4 *)(local_30 + (long)local_68 * 4) =
             *(undefined4 *)(local_30 + (long)local_7c * 4);
        *(undefined4 *)(local_30 + (long)local_7c * 4) = uVar4;
      }
    }
    local_a0 = enorm_((int *)CONCAT44(iVar5,local_a4),
                      (double *)CONCAT44((*local_8 - local_68) + 1,in_stack_ffffffffffffffb8));
    if ((local_a0 != 0.0) || (NAN(local_a0))) {
      pdVar1 = (double *)(local_18 + (long)(local_68 + local_68 * iVar3) * 8);
      if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
        local_a0 = -local_a0;
      }
      iVar11 = *local_8;
      for (local_64 = local_68; local_64 <= iVar11; local_64 = local_64 + 1) {
        lVar8 = (long)(local_64 + local_68 * iVar3);
        *(double *)(local_18 + lVar8 * 8) = *(double *)(local_18 + lVar8 * 8) / local_a0;
      }
      lVar8 = (long)(local_68 + local_68 * iVar3);
      *(double *)(local_18 + lVar8 * 8) = *(double *)(local_18 + lVar8 * 8) + 1.0;
      local_6c = local_68 + 1;
      if (local_6c <= *local_10) {
        iVar11 = *local_10;
        for (; local_6c <= iVar11; local_6c = local_6c + 1) {
          local_78 = 0.0;
          for (local_64 = local_68; local_64 <= *local_8; local_64 = local_64 + 1) {
            local_78 = *(double *)(local_18 + (long)(local_64 + local_68 * iVar3) * 8) *
                       *(double *)(local_18 + (long)(local_64 + local_6c * iVar3) * 8) + local_78;
          }
          dVar10 = *(double *)(local_18 + (long)(local_68 + local_68 * iVar3) * 8);
          in_stack_ffffffffffffffb8 = *local_8;
          for (local_64 = local_68; local_64 <= in_stack_ffffffffffffffb8; local_64 = local_64 + 1)
          {
            lVar8 = (long)(local_64 + local_6c * iVar3);
            *(double *)(local_18 + lVar8 * 8) =
                 -(local_78 / dVar10) *
                 *(double *)(local_18 + (long)(local_64 + local_68 * iVar3) * 8) +
                 *(double *)(local_18 + lVar8 * 8);
          }
          if ((*local_28 != 0) &&
             ((dVar10 = *(double *)(lVar7 + (long)local_6c * 8), dVar10 != 0.0 || (NAN(dVar10))))) {
            dVar10 = *(double *)(local_18 + (long)(local_68 + local_6c * iVar3) * 8) /
                     *(double *)(lVar7 + (long)local_6c * 8);
            local_b0 = -dVar10 * dVar10 + 1.0;
            if (local_b0 <= 0.0) {
              local_b0 = 0.0;
            }
            dVar10 = sqrt(local_b0);
            *(double *)(lVar7 + (long)local_6c * 8) =
                 dVar10 * *(double *)(lVar7 + (long)local_6c * 8);
            dVar10 = *(double *)(lVar7 + (long)local_6c * 8) /
                     *(double *)(lVar6 + (long)local_6c * 8);
            if (dVar10 * dVar10 * 0.05 <= dVar9) {
              in_stack_ffffffffffffffb8 = *local_8 - local_68;
              dVar10 = enorm_((int *)CONCAT44(iVar5,local_a4),
                              (double *)CONCAT44(iVar11,in_stack_ffffffffffffffb8));
              *(double *)(lVar7 + (long)local_6c * 8) = dVar10;
              *(undefined8 *)(lVar6 + (long)local_6c * 8) =
                   *(undefined8 *)(lVar7 + (long)local_6c * 8);
            }
          }
        }
      }
    }
    *(double *)(lVar7 + (long)local_68 * 8) = -local_a0;
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(qrfac)(const int *m, const int *n, real *a, const int *
	lda, const int *pivot, int *ipvt, const int *lipvt, real *rdiag,
	 real *acnorm, real *wa)
{
    /* Initialized data */

#define p05 .05
    const int c__1 = 1;

    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3;
    real d__1, d__2, d__3;

    /* Local variables */
    int i__, j, k, jp1;
    real sum;
    int kmax;
    real temp;
    int minmn;
    real epsmch;
    real ajnorm;

/*     ********** */

/*     subroutine qrfac */

/*     this subroutine uses householder transformations with column */
/*     pivoting (optional) to compute a qr factorization of the */
/*     m by n matrix a. that is, qrfac determines an orthogonal */
/*     matrix q, a permutation matrix p, and an upper trapezoidal */
/*     matrix r with diagonal elements of nonincreasing magnitude, */
/*     such that a*p = q*r. the householder transformation for */
/*     column k, k = 1,2,...,min(m,n), is of the form */

/*                           t */
/*           i - (1/u(k))*u*u */

/*     where u has zeros in the first k-1 positions. the form of */
/*     this transformation and the method of pivoting first */
/*     appeared in the corresponding linpack subroutine. */

/*     the subroutine statement is */

/*       subroutine qrfac(m,n,a,lda,pivot,ipvt,lipvt,rdiag,acnorm,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       a is an m by n array. on input a contains the matrix for */
/*         which the qr factorization is to be computed. on output */
/*         the strict upper trapezoidal part of a contains the strict */
/*         upper trapezoidal part of r, and the lower trapezoidal */
/*         part of a contains a factored form of q (the non-trivial */
/*         elements of the u vectors described above). */

/*       lda is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array a. */

/*       pivot is a logical input variable. if pivot is set true, */
/*         then column pivoting is enforced. if pivot is set false, */
/*         then no column pivoting is done. */

/*       ipvt is an integer output array of length lipvt. ipvt */
/*         defines the permutation matrix p such that a*p = q*r. */
/*         column j of p is column ipvt(j) of the identity matrix. */
/*         if pivot is false, ipvt is not referenced. */

/*       lipvt is a positive integer input variable. if pivot is false, */
/*         then lipvt may be as small as 1. if pivot is true, then */
/*         lipvt must be at least n. */

/*       rdiag is an output array of length n which contains the */
/*         diagonal elements of r. */

/*       acnorm is an output array of length n which contains the */
/*         norms of the corresponding columns of the input matrix a. */
/*         if this information is not needed, then acnorm can coincide */
/*         with rdiag. */

/*       wa is a work array of length n. if pivot is false, then wa */
/*         can coincide with rdiag. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dmax1,dsqrt,min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa;
    --acnorm;
    --rdiag;
    a_dim1 = *lda;
    a_offset = 1 + a_dim1 * 1;
    a -= a_offset;
    --ipvt;
    (void)lipvt;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

/*     compute the initial column norms and initialize several arrays. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	acnorm[j] = __minpack_func__(enorm)(m, &a[j * a_dim1 + 1]);
	rdiag[j] = acnorm[j];
	wa[j] = rdiag[j];
	if (*pivot) {
	    ipvt[j] = j;
	}
/* L10: */
    }

/*     reduce a to r with householder transformations. */

    minmn = min(*m,*n);
    i__1 = minmn;
    for (j = 1; j <= i__1; ++j) {
	if (! (*pivot)) {
	    goto L40;
	}

/*        bring the column of largest norm into the pivot position. */

	kmax = j;
	i__2 = *n;
	for (k = j; k <= i__2; ++k) {
	    if (rdiag[k] > rdiag[kmax]) {
		kmax = k;
	    }
/* L20: */
	}
	if (kmax == j) {
	    goto L40;
	}
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    temp = a[i__ + j * a_dim1];
	    a[i__ + j * a_dim1] = a[i__ + kmax * a_dim1];
	    a[i__ + kmax * a_dim1] = temp;
/* L30: */
	}
	rdiag[kmax] = rdiag[j];
	wa[kmax] = wa[j];
	k = ipvt[j];
	ipvt[j] = ipvt[kmax];
	ipvt[kmax] = k;
L40:

/*        compute the householder transformation to reduce the */
/*        j-th column of a to a multiple of the j-th unit vector. */

	i__2 = *m - j + 1;
	ajnorm = __minpack_func__(enorm)(&i__2, &a[j + j * a_dim1]);
	if (ajnorm == 0.) {
	    goto L100;
	}
	if (a[j + j * a_dim1] < 0.) {
	    ajnorm = -ajnorm;
	}
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
	    a[i__ + j * a_dim1] /= ajnorm;
/* L50: */
	}
	a[j + j * a_dim1] += 1;

/*        apply the transformation to the remaining columns */
/*        and update the norms. */

	jp1 = j + 1;
	if (*n < jp1) {
	    goto L100;
	}
	i__2 = *n;
	for (k = jp1; k <= i__2; ++k) {
	    sum = 0.;
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
		sum += a[i__ + j * a_dim1] * a[i__ + k * a_dim1];
/* L60: */
	    }
	    temp = sum / a[j + j * a_dim1];
	    i__3 = *m;
	    for (i__ = j; i__ <= i__3; ++i__) {
		a[i__ + k * a_dim1] -= temp * a[i__ + j * a_dim1];
/* L70: */
	    }
	    if (! (*pivot) || rdiag[k] == 0.) {
		goto L80;
	    }
	    temp = a[j + k * a_dim1] / rdiag[k];
/* Computing MAX */
/* Computing 2nd power */
	    d__3 = temp;
	    d__1 = 0., d__2 = 1 - d__3 * d__3;
	    rdiag[k] *= sqrt((max(d__1,d__2)));
/* Computing 2nd power */
	    d__1 = rdiag[k] / wa[k];
	    if (p05 * (d__1 * d__1) > epsmch) {
		goto L80;
	    }
	    i__3 = *m - j;
	    rdiag[k] = __minpack_func__(enorm)(&i__3, &a[jp1 + k * a_dim1]);
	    wa[k] = rdiag[k];
L80:
/* L90: */
	    ;
	}
L100:
	rdiag[j] = -ajnorm;
/* L110: */
    }
    return;

/*     last card of subroutine qrfac. */

}